

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

int ffgmtf(fitsfile *infptr,fitsfile *outfptr,long member,int tfopt,int *status)

{
  int iVar1;
  int in_ECX;
  int *in_R8;
  fitsfile *mfptr;
  int *in_stack_000019f0;
  fitsfile **in_stack_000019f8;
  long in_stack_00001a00;
  fitsfile *in_stack_00001a08;
  int *in_stack_00001da0;
  int in_stack_00001dac;
  long in_stack_00001db0;
  fitsfile *in_stack_00001db8;
  int *in_stack_000027f0;
  int in_stack_000027fc;
  fitsfile *in_stack_00002800;
  fitsfile *in_stack_00002808;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 local_4;
  
  if (*in_R8 == 0) {
    if ((in_ECX == 3) || (in_ECX == 0)) {
      iVar1 = ffgmop(in_stack_00001a08,in_stack_00001a00,in_stack_000019f8,in_stack_000019f0);
      *in_R8 = iVar1;
      iVar1 = ffgtam(in_stack_00002808,in_stack_00002800,in_stack_000027fc,in_stack_000027f0);
      *in_R8 = iVar1;
      iVar1 = ffclos((fitsfile *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),in_R8);
      *in_R8 = iVar1;
      if (in_ECX == 3) {
        iVar1 = ffgmrm(in_stack_00001db8,in_stack_00001db0,in_stack_00001dac,in_stack_00001da0);
        *in_R8 = iVar1;
      }
    }
    else {
      *in_R8 = 0x15b;
      ffpmsg((char *)0x1df993);
    }
    local_4 = *in_R8;
  }
  else {
    local_4 = *in_R8;
  }
  return local_4;
}

Assistant:

int ffgmtf(fitsfile *infptr,   /* FITS file pointer to source grouping table */
	   fitsfile *outfptr,  /* FITS file pointer to target grouping table */
	   long      member,   /* member ID within source grouping table     */
	   int       tfopt,    /* code specifying transfer opts:
				  OPT_MCP_ADD (0) ==> copy member to dest.
				  OPT_MCP_MOV (3) ==> move member to dest.   */
	   int      *status)   /* return status code                         */

/*
  transfer a group member from one grouping table to another. The source
  grouping table must be the CHDU of the fitsfile pointed to by infptr, and 
  the destination grouping table must be the CHDU of the fitsfile to by 
  outfptr. If the tfopt parameter is OPT_MCP_ADD then the member is made a 
  member of the target group and remains a member of the source group. If
  the tfopt parameter is OPT_MCP_MOV then the member is deleted from the 
  source group after the transfer to the destination group. The member to be
  transfered is identified by its row number within the source grouping table.
*/

{
  fitsfile *mfptr = NULL;


  if(*status != 0) return(*status);

  if(tfopt != OPT_MCP_MOV && tfopt != OPT_MCP_ADD)
    {
      *status = BAD_OPTION;
      ffpmsg("Invalid value specified for the tfopt parameter (ffgmtf)");
    }
  else
    {
      /* open the member of infptr to be transfered */

      *status = fits_open_member(infptr,member,&mfptr,status);
      
      /* add the member to the outfptr grouping table */
      
      *status = fits_add_group_member(outfptr,mfptr,0,status);
      
      /* close the member HDU */
      
      *status = fits_close_file(mfptr,status);
      
      /* 
	 if the tfopt is "move member" then remove it from the infptr 
	 grouping table
      */

      if(tfopt == OPT_MCP_MOV)
	*status = fits_remove_member(infptr,member,OPT_RM_ENTRY,status);
    }
  
  return(*status);
}